

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ping-pong.c
# Opt level: O2

void pinger_write_ping(pinger_t *pinger)

{
  int iVar1;
  uv_write_t *req;
  undefined8 uVar2;
  uint nbufs;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  uv_buf_t uVar7;
  char *pcVar8;
  char *pcVar9;
  int64_t eval_b;
  int64_t eval_a;
  uv_buf_t local_78 [5];
  
  if (pinger->vectored_writes == 0) {
    local_78[0] = uv_buf_init(PING,5);
    nbufs = 1;
  }
  else {
    pcVar6 = PING;
    nbufs = 5;
    for (lVar5 = 8; lVar5 != 0x58; lVar5 = lVar5 + 0x10) {
      uVar7 = uv_buf_init(pcVar6,1);
      *(char **)((long)local_78 + lVar5 + -8) = uVar7.base;
      *(size_t *)((long)&local_78[0].base + lVar5) = uVar7.len;
      pcVar6 = pcVar6 + 1;
    }
  }
  req = (uv_write_t *)malloc(200);
  if (req == (uv_write_t *)0x0) {
    pcVar4 = "!=";
    pcVar9 = "!=";
    lVar5 = 0;
    pcVar8 = "NULL";
    pcVar6 = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
    pcVar3 = "req";
    uVar2 = 0x71;
  }
  else {
    req->data = (void *)0x0;
    iVar1 = uv_write(req,(uv_stream_t *)&(pinger->stream).tcp,local_78,nbufs,pinger_after_write);
    lVar5 = (long)iVar1;
    eval_a = lVar5;
    if (lVar5 == 0) {
      puts("PING");
      return;
    }
    pcVar4 = "==";
    pcVar6 = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
    pcVar3 = "uv_write(req, stream, bufs, nbufs, pinger_after_write)";
    uVar2 = 0x73;
    pcVar9 = "==";
    pcVar8 = "0";
  }
  fprintf(_stderr,pcVar6,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ping-pong.c"
          ,uVar2,pcVar3,pcVar4,pcVar8,lVar5,pcVar9,0);
  abort();
}

Assistant:

static void pinger_write_ping(pinger_t* pinger) {
  uv_stream_t* stream;
  uv_write_t* req;
  uv_buf_t bufs[sizeof PING - 1];
  int i, nbufs;

  stream = (uv_stream_t*) &pinger->stream.tcp;

  if (!pinger->vectored_writes) {
    /* Write a single buffer. */
    nbufs = 1;
    bufs[0] = uv_buf_init(PING, sizeof PING - 1);
  } else {
    /* Write multiple buffers, each with one byte in them. */
    nbufs = sizeof PING - 1;
    for (i = 0; i < nbufs; i++) {
      bufs[i] = uv_buf_init(&PING[i], 1);
    }
  }

  req = malloc(sizeof(*req));
  ASSERT_NOT_NULL(req);
  req->data = NULL;
  ASSERT_OK(uv_write(req, stream, bufs, nbufs, pinger_after_write));

  puts("PING");
}